

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O2

void do_cmd_wiz_teleport_to(command *cmd)

{
  loc grid_00;
  loc grid_01;
  _Bool _Var1;
  wchar_t wVar2;
  source sVar3;
  source origin;
  loc grid;
  
  wVar2 = cmd_get_arg_point((command_conflict *)cmd,"point",&grid);
  if (wVar2 != L'\0') {
    _Var1 = target_set_interactive(L'\x02',L'\xffffffff',L'\xffffffff');
    if (!_Var1) {
      return;
    }
    target_get((loc_conflict *)&grid);
    grid_00.y = grid.y;
    grid_00.x = grid.x;
    cmd_set_arg_point((command_conflict *)cmd,"point",grid_00);
  }
  grid_01.y = grid.y;
  grid_01.x = grid.x;
  _Var1 = square_ispassable(cave,grid_01);
  if (_Var1) {
    sVar3 = source_player();
    origin.which = sVar3.which;
    origin._4_4_ = 0;
    origin.what = sVar3.what;
    effect_simple(L'<',origin,"0",L'\0',L'\0',L'\0',grid.y,grid.x,(_Bool *)0x0);
  }
  else {
    msg("The square you are aiming for is impassable.");
  }
  return;
}

Assistant:

void do_cmd_wiz_teleport_to(struct command *cmd)
{
	struct loc grid;

	if (cmd_get_arg_point(cmd, "point", &grid) != CMD_OK) {
		/* Use the targeting function. */
		if (!target_set_interactive(TARGET_LOOK, -1, -1)) return;

		/* Grab the target coordinates. */
		target_get(&grid);

		/* Record in the command to facilitate repetition. */
		cmd_set_arg_point(cmd, "point", grid);
	}

	/* Test for passable terrain. */
	if (square_ispassable(cave, grid)) {
		/* Teleport to the target */
		effect_simple(EF_TELEPORT_TO, source_player(), "0", 0, 0, 0,
			grid.y, grid.x, NULL);
	} else {
		msg("The square you are aiming for is impassable.");
	}
}